

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  string *__lhs;
  bool bVar1;
  __type _Var2;
  string field_name;
  allocator local_83;
  allocator local_82;
  allocator local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_80,"[",(allocator *)&local_60);
  bVar1 = TryConsume(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar1) {
    bVar1 = ConsumeTypeUrlOrFullTypeName(this);
    if (!bVar1) {
      return false;
    }
    std::__cxx11::string::string((string *)&local_80,"]",(allocator *)&local_60);
    bVar1 = Consume(this,&local_80);
  }
  else {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    bVar1 = ConsumeIdentifier(this,&local_80);
  }
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar1 == false) {
    return false;
  }
  std::__cxx11::string::string((string *)&local_80,":",&local_83);
  bVar1 = TryConsume(this,&local_80);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_60,"{",&local_81);
    __lhs = &(this->tokenizer_).current_.text;
    _Var2 = std::operator==(__lhs,&local_60);
    if (_Var2) {
      std::__cxx11::string::~string((string *)&local_60);
      goto LAB_0027ef49;
    }
    std::__cxx11::string::string((string *)&local_40,"<",&local_82);
    _Var2 = std::operator==(__lhs,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    if (!_Var2) {
      bVar1 = SkipFieldValue(this);
      goto LAB_0027ef5b;
    }
  }
  else {
LAB_0027ef49:
    std::__cxx11::string::~string((string *)&local_80);
  }
  bVar1 = SkipFieldMessage(this);
LAB_0027ef5b:
  if (bVar1 == false) {
    return false;
  }
  std::__cxx11::string::string((string *)&local_80,";",(allocator *)&local_40);
  bVar1 = TryConsume(this,&local_80);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_60,",",&local_83);
    TryConsume(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::~string((string *)&local_80);
  return true;
}

Assistant:

bool SkipField() {
    if (TryConsume("[")) {
      // Extension name or type URL.
      DO(ConsumeTypeUrlOrFullTypeName());
      DO(Consume("]"));
    } else {
      std::string field_name;
      DO(ConsumeIdentifier(&field_name));
    }

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
      DO(SkipFieldValue());
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }